

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_create_workers(AV1_PRIMARY *ppi,int num_workers)

{
  AVxWorker *pAVar1;
  int iVar2;
  AVxWorkerInterface *pAVar3;
  AVxWorker *pAVar4;
  EncWorkerData *pEVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  uVar8 = (ulong)(uint)num_workers;
  pAVar3 = aom_get_worker_interface();
  pAVar4 = (AVxWorker *)aom_malloc((long)num_workers * 0x38);
  (ppi->p_mt_info).workers = pAVar4;
  if (pAVar4 == (AVxWorker *)0x0) {
    aom_internal_error(&ppi->error,AOM_CODEC_MEM_ERROR,"Failed to allocate p_mt_info->workers");
  }
  pEVar5 = (EncWorkerData *)aom_calloc((long)num_workers,0x1d0);
  (ppi->p_mt_info).tile_thr_data = pEVar5;
  if (pEVar5 == (EncWorkerData *)0x0) {
    aom_internal_error(&ppi->error,AOM_CODEC_MEM_ERROR,"Failed to allocate p_mt_info->tile_thr_data"
                      );
  }
  if (num_workers < 1) {
    uVar8 = 0;
  }
  lVar9 = 0x1cc;
  lVar7 = 0;
  for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    pAVar1 = (ppi->p_mt_info).workers;
    pEVar5 = (ppi->p_mt_info).tile_thr_data;
    pAVar4 = (AVxWorker *)((long)&pAVar1->impl_ + lVar7);
    (*pAVar3->init)(pAVar4);
    *(char **)((long)&pAVar1->thread_name + lVar7) = "aom enc worker";
    *(int *)((pEVar5->error_info).detail + lVar9 + -0x20) = (int)uVar6;
    *(int *)((pEVar5->error_info).detail + lVar9 + -0x24) = (int)uVar6;
    if (uVar6 != 0) {
      iVar2 = (*pAVar3->reset)(pAVar4);
      if (iVar2 == 0) {
        aom_internal_error(&ppi->error,AOM_CODEC_ERROR,"Tile encoder thread creation failed");
      }
    }
    (*pAVar3->sync)(pAVar4);
    (ppi->p_mt_info).num_workers = (ppi->p_mt_info).num_workers + 1;
    lVar9 = lVar9 + 0x1d0;
    lVar7 = lVar7 + 0x38;
  }
  return;
}

Assistant:

void av1_create_workers(AV1_PRIMARY *ppi, int num_workers) {
  PrimaryMultiThreadInfo *const p_mt_info = &ppi->p_mt_info;
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  assert(p_mt_info->num_workers == 0);

  AOM_CHECK_MEM_ERROR(&ppi->error, p_mt_info->workers,
                      aom_malloc(num_workers * sizeof(*p_mt_info->workers)));

  AOM_CHECK_MEM_ERROR(
      &ppi->error, p_mt_info->tile_thr_data,
      aom_calloc(num_workers, sizeof(*p_mt_info->tile_thr_data)));

  for (int i = 0; i < num_workers; ++i) {
    AVxWorker *const worker = &p_mt_info->workers[i];
    EncWorkerData *const thread_data = &p_mt_info->tile_thr_data[i];

    winterface->init(worker);
    worker->thread_name = "aom enc worker";

    thread_data->thread_id = i;
    // Set the starting tile for each thread.
    thread_data->start = i;

    if (i > 0) {
      // Create threads
      if (!winterface->reset(worker))
        aom_internal_error(&ppi->error, AOM_CODEC_ERROR,
                           "Tile encoder thread creation failed");
    }
    winterface->sync(worker);

    ++p_mt_info->num_workers;
  }
}